

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

int main(void)

{
  initializer_list<int> __l;
  allocator<int> local_69;
  int local_68 [12];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> vec;
  
  vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  local_68[4] = 0x20;
  local_68[5] = 1;
  local_68[6] = 0x2e;
  local_68[7] = 99999;
  local_68[0] = 0x59;
  local_68[1] = 0x4e;
  local_68[2] = 0x43;
  local_68[3] = 1;
  local_68[8] = 0x3e0;
  local_38 = local_68;
  local_30 = 9;
  std::allocator<int>::allocator(&local_69);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_28,__l,&local_69);
  std::allocator<int>::~allocator(&local_69);
  std::operator<<((ostream *)&std::cout,"Before: ");
  show((vector<int,_std::allocator<int>_> *)local_28);
  insertionSort<int>((vector<int,_std::allocator<int>_> *)local_28);
  std::operator<<((ostream *)&std::cout,"After: ");
  show((vector<int,_std::allocator<int>_> *)local_28);
  vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_;
}

Assistant:

int main()
{
    vector<int> vec = {89, 78, 67, 1, 32, 1, 46, 99999, 992};
    cout << "Before: ";
    show(vec);
    insertionSort(vec);
    cout << "After: ";
    show(vec);
    return 0;
}